

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_unpack(bcf1_t *b,int which)

{
  char *pcVar1;
  uint *puVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  size_t __ptr;
  short sVar14;
  uint8_t *puVar6;
  void *pvVar7;
  char **ppcVar8;
  ulong uVar9;
  int *piVar10;
  bcf_info_t *pbVar11;
  long lVar12;
  bcf_fmt_t *pbVar13;
  int iVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  undefined1 auVar19 [8];
  int *piVar20;
  size_t __size;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  byte *pbVar24;
  byte *pbVar25;
  uint uVar26;
  int *piVar27;
  uint8_t *ptr_start;
  byte *pbVar28;
  undefined8 uStack_70;
  int aiStack_68 [4];
  uint8_t *local_58;
  uint local_4c;
  undefined1 local_48 [8];
  kstring_t tmp;
  
  if ((b->shared).l == 0) {
    return 0;
  }
  uVar22 = 7;
  if ((which & 4U) == 0) {
    uVar22 = (uint)which >> 1 & 1;
  }
  uVar22 = uVar22 | which;
  piVar20 = aiStack_68;
  if (((uVar22 & 1) == 0) || (piVar20 = aiStack_68, (b->unpacked & 1) != 0)) goto LAB_0011f43e;
  puVar6 = (uint8_t *)(b->shared).s;
  local_48 = (undefined1  [8])0x0;
  tmp.m = (size_t)(b->d).id;
  tmp.l = (size_t)(b->d).m_id;
  uStack_70 = 0x11f20b;
  local_4c = uVar22;
  local_58 = bcf_fmt_sized_array((kstring_t *)local_48,puVar6);
  b->unpack_size[0] = (int)local_58 - (int)puVar6;
  uVar9 = (long)local_48 + 1;
  if (uVar9 < tmp.l) {
LAB_0011f27e:
    *(undefined1 *)(tmp.m + (long)local_48) = 0;
    *(undefined1 *)(tmp.m + uVar9) = 0;
  }
  else {
    uVar9 = uVar9 >> 1 | uVar9;
    uVar9 = uVar9 >> 2 | uVar9;
    uVar9 = uVar9 >> 4 | uVar9;
    uVar9 = uVar9 >> 8 | uVar9;
    tmp.l = (uVar9 >> 0x10 | uVar9) + 1;
    uStack_70 = 0x11f26d;
    pvVar7 = realloc((void *)tmp.m,tmp.l);
    if (pvVar7 != (void *)0x0) {
      uVar9 = (long)local_48 + 1;
      tmp.m = (size_t)pvVar7;
      goto LAB_0011f27e;
    }
  }
  (b->d).id = (char *)tmp.m;
  (b->d).m_id = (int)tmp.l;
  local_48 = (undefined1  [8])0x0;
  tmp.m = (size_t)(b->d).als;
  iVar16 = (b->d).m_als;
  tmp.l = (long)iVar16;
  uVar9 = *(ulong *)&b->field_0x10;
  uVar22 = (uint)(uVar9 >> 0x10) & 0xffff;
  lVar12 = -(ulong)(uVar22 * 4 + 0xf & 0xfffffff0);
  piVar20 = (int *)((long)aiStack_68 + lVar12);
  puVar6 = local_58;
  if ((uint)uVar9 < 0x10000) {
    iVar23 = (int)local_58;
  }
  else {
    uVar21 = 0;
    aiStack_68[3] = which;
    do {
      *(undefined4 *)((long)piVar20 + uVar21 * 4) = local_48._0_4_;
      *(undefined8 *)((long)aiStack_68 + lVar12 + -8) = 0x11f308;
      puVar6 = bcf_fmt_sized_array((kstring_t *)local_48,puVar6);
      __ptr = tmp.m;
      uVar9 = (long)local_48 + 1;
      auVar19 = local_48;
      if (uVar9 < tmp.l) {
LAB_0011f371:
        local_48 = (undefined1  [8])uVar9;
        *(undefined1 *)(tmp.m + (long)auVar19) = 0;
        *(undefined1 *)(tmp.m + uVar9) = 0;
      }
      else {
        uVar9 = uVar9 >> 1 | uVar9;
        uVar9 = uVar9 >> 2 | uVar9;
        uVar9 = uVar9 >> 4 | uVar9;
        uVar9 = uVar9 >> 8 | uVar9;
        __size = (uVar9 >> 0x10 | uVar9) + 1;
        tmp.l = __size;
        *(undefined8 *)((long)aiStack_68 + lVar12 + -8) = 0x11f360;
        pvVar7 = realloc((void *)__ptr,__size);
        if (pvVar7 != (void *)0x0) {
          tmp.m = (size_t)pvVar7;
          uVar9 = (long)local_48 + 1;
          auVar19 = local_48;
          goto LAB_0011f371;
        }
      }
      uVar21 = uVar21 + 1;
      uVar9 = *(ulong *)&b->field_0x10;
      uVar17 = uVar9 >> 0x10 & 0xffff;
      uVar22 = (uint)uVar17;
    } while (uVar21 < uVar17);
    iVar23 = (int)local_58;
    which = aiStack_68[3];
    iVar16 = (int)tmp.l;
  }
  sVar14 = (short)(uVar9 >> 0x10);
  b->unpack_size[1] = (int)puVar6 - iVar23;
  (b->d).als = (char *)tmp.m;
  (b->d).m_als = iVar16;
  if ((b->d).m_allele < (int)uVar22) {
    uVar22 = (int)(uVar22 - 1) >> 1 | uVar22 - 1;
    uVar22 = (int)uVar22 >> 2 | uVar22;
    uVar22 = (int)uVar22 >> 4 | uVar22;
    uVar22 = (int)uVar22 >> 8 | uVar22;
    uVar22 = (int)uVar22 >> 0x10 | uVar22;
    (b->d).m_allele = uVar22 + 1;
    ppcVar8 = (b->d).allele;
    *(undefined8 *)((long)aiStack_68 + lVar12 + -8) = 0x11f3ff;
    ppcVar8 = (char **)realloc(ppcVar8,(long)(int)uVar22 * 8 + 8);
    (b->d).allele = ppcVar8;
    sVar14 = (short)((ulong)*(undefined8 *)&b->field_0x10 >> 0x10);
  }
  if (sVar14 != 0) {
    uVar9 = 0;
    do {
      (b->d).allele[uVar9] = (b->d).als + *(int *)((long)piVar20 + uVar9 * 4);
      uVar9 = uVar9 + 1;
    } while (uVar9 < *(ushort *)&b->field_0x12);
  }
  *(byte *)&b->unpacked = (byte)b->unpacked | 1;
  uVar22 = local_4c;
LAB_0011f43e:
  if (((uVar22 & 2) != 0) && ((b->unpacked & 2) == 0)) {
    pcVar5 = (b->shared).s;
    pcVar1 = pcVar5 + (long)b->unpack_size[1] + (long)b->unpack_size[0];
    bVar3 = pcVar5[(long)b->unpack_size[1] + (long)b->unpack_size[0]];
    if (bVar3 < 0x10) {
      piVar27 = (int *)(pcVar1 + 1);
      (b->d).n_flt = 0;
    }
    else {
      if (bVar3 < 0xf0) {
        piVar27 = (int *)(pcVar1 + 1);
        uVar26 = (uint)(bVar3 >> 4);
      }
      else if ((pcVar1[1] & 0xfU) == 2) {
        piVar27 = (int *)(pcVar1 + 4);
        uVar26 = (uint)*(short *)(pcVar1 + 2);
      }
      else if ((pcVar1[1] & 0xfU) == 1) {
        piVar27 = (int *)(pcVar1 + 3);
        uVar26 = (uint)pcVar1[2];
      }
      else {
        piVar27 = (int *)(pcVar1 + 6);
        uVar26 = *(uint *)(pcVar1 + 2);
      }
      (b->d).n_flt = uVar26;
      if ((b->d).m_flt < (int)uVar26) {
        uVar26 = (int)(uVar26 - 1) >> 1 | uVar26 - 1;
        uVar26 = (int)uVar26 >> 2 | uVar26;
        uVar26 = (int)uVar26 >> 4 | uVar26;
        uVar26 = (int)uVar26 >> 8 | uVar26;
        uVar26 = (int)uVar26 >> 0x10 | uVar26;
        (b->d).m_flt = uVar26 + 1;
        piVar10 = (b->d).flt;
        local_4c = uVar22;
        *(undefined8 *)((long)piVar20 + -8) = 0x11f511;
        piVar10 = (int *)realloc(piVar10,(long)(int)uVar26 * 4 + 4);
        (b->d).flt = piVar10;
        uVar26 = (b->d).n_flt;
        uVar22 = local_4c;
      }
      if (0 < (int)uVar26) {
        piVar10 = (b->d).flt;
        lVar12 = 0;
        do {
          if ((bVar3 & 0xf) == 2) {
            iVar16 = (int)(short)*piVar27;
            piVar27 = (int *)((long)piVar27 + 2);
          }
          else if ((bVar3 & 0xf) == 1) {
            iVar16 = (int)(char)*piVar27;
            piVar27 = (int *)((long)piVar27 + 1);
          }
          else {
            iVar16 = *piVar27;
            piVar27 = piVar27 + 1;
          }
          piVar10[lVar12] = iVar16;
          lVar12 = lVar12 + 1;
        } while (lVar12 < (b->d).n_flt);
      }
    }
    b->unpack_size[2] = (int)piVar27 - (int)pcVar1;
    *(byte *)&b->unpacked = (byte)b->unpacked | 2;
  }
  if (((uVar22 & 4) != 0) && ((b->unpacked & 4) == 0)) {
    iVar16 = b->unpack_size[0];
    pcVar1 = (b->shared).s;
    iVar23 = b->unpack_size[1];
    iVar4 = b->unpack_size[2];
    iVar15 = (b->d).m_info;
    if (iVar15 < (int)(uint)*(ushort *)&b->field_0x10) {
      uVar22 = *(ushort *)&b->field_0x10 - 1;
      uVar22 = (int)uVar22 >> 1 | uVar22;
      uVar22 = (int)uVar22 >> 2 | uVar22;
      uVar22 = (int)uVar22 >> 4 | uVar22;
      uVar22 = (int)uVar22 >> 8 | uVar22;
      uVar22 = (int)uVar22 >> 0x10 | uVar22;
      (b->d).m_info = uVar22 + 1;
      pbVar11 = (b->d).info;
      *(undefined8 *)((long)piVar20 + -8) = 0x11f5f6;
      pbVar11 = (bcf_info_t *)realloc(pbVar11,(long)(int)uVar22 * 0x20 + 0x20);
      (b->d).info = pbVar11;
      iVar15 = (b->d).m_info;
    }
    if (0 < iVar15) {
      lVar12 = 0x1c;
      lVar18 = 0;
      do {
        puVar2 = (uint *)((long)&((b->d).info)->key + lVar12);
        *puVar2 = *puVar2 & 0x7fffffff;
        lVar18 = lVar18 + 1;
        lVar12 = lVar12 + 0x20;
      } while (lVar18 < (b->d).m_info);
    }
    if (*(short *)&b->field_0x10 != 0) {
      pbVar28 = (byte *)(pcVar1 + (long)iVar23 + (long)iVar4 + (long)iVar16);
      lVar12 = 0x1c;
      uVar9 = 0;
      do {
        if ((*pbVar28 & 0xf) == 2) {
          pbVar25 = pbVar28 + 3;
          iVar16 = (int)*(short *)(pbVar28 + 1);
        }
        else if ((*pbVar28 & 0xf) == 1) {
          pbVar25 = pbVar28 + 2;
          iVar16 = (int)(char)pbVar28[1];
        }
        else {
          pbVar25 = pbVar28 + 5;
          iVar16 = *(int *)(pbVar28 + 1);
        }
        pbVar11 = (b->d).info;
        *(int *)((long)pbVar11 + lVar12 + -0x1c) = iVar16;
        uVar22 = *pbVar25 & 0xf;
        *(uint *)((long)pbVar11 + lVar12 + -0x18) = uVar22;
        if (*pbVar25 < 0xf0) {
          pbVar24 = pbVar25 + 1;
          uVar26 = (uint)(*pbVar25 >> 4);
        }
        else if ((pbVar25[1] & 0xf) == 2) {
          uVar26 = (uint)*(short *)(pbVar25 + 2);
          pbVar24 = pbVar25 + 4;
        }
        else if ((pbVar25[1] & 0xf) == 1) {
          uVar26 = (uint)(char)pbVar25[2];
          pbVar24 = pbVar25 + 3;
        }
        else {
          uVar26 = *(uint *)(pbVar25 + 2);
          pbVar24 = pbVar25 + 6;
        }
        *(uint *)((long)pbVar11 + lVar12 + -0x14) = uVar26;
        *(byte **)((long)pbVar11 + lVar12 + -0xc) = pbVar24;
        *(uint *)((long)&pbVar11->key + lVar12) = (int)pbVar24 - (int)pbVar28 & 0x7fffffff;
        *(undefined4 *)((long)pbVar11 + lVar12 + -0x10) = 0;
        if (uVar26 != 1) goto switchD_0011f71d_caseD_4;
        switch(uVar22) {
        case 1:
        case 7:
          iVar16 = (int)(char)*pbVar24;
          break;
        case 2:
          iVar16 = (int)*(short *)pbVar24;
          break;
        case 3:
          iVar16 = *(int *)pbVar24;
          break;
        default:
          goto switchD_0011f71d_caseD_4;
        case 5:
          *(undefined4 *)((long)pbVar11 + lVar12 + -0x10) = *(undefined4 *)pbVar24;
          goto switchD_0011f71d_caseD_4;
        }
        *(int *)((long)pbVar11 + lVar12 + -0x10) = iVar16;
switchD_0011f71d_caseD_4:
        iVar16 = uVar26 << (bcf_type_shift[uVar22] & 0x1f);
        pbVar28 = pbVar24 + iVar16;
        *(int *)((long)pbVar11 + lVar12 + -4) = iVar16;
        uVar9 = uVar9 + 1;
        lVar12 = lVar12 + 0x20;
      } while (uVar9 < *(ushort *)&b->field_0x10);
    }
    *(byte *)&b->unpacked = (byte)b->unpacked | 4;
  }
  if ((((which & 8U) != 0) && (*(ulong *)&b->field_0x10 >> 0x28 != 0)) && ((b->unpacked & 8) == 0))
  {
    pbVar28 = (byte *)(b->indiv).s;
    uVar22 = (uint)(*(ulong *)&b->field_0x10 >> 0x20) & 0xff;
    iVar16 = (b->d).m_fmt;
    if (iVar16 < (int)uVar22) {
      uVar22 = uVar22 - 1;
      uVar22 = (int)uVar22 >> 1 | uVar22;
      uVar22 = (int)uVar22 >> 2 | uVar22;
      uVar22 = (int)uVar22 >> 4 | uVar22;
      uVar22 = (int)uVar22 >> 8 | uVar22;
      uVar22 = (int)uVar22 >> 0x10 | uVar22;
      (b->d).m_fmt = uVar22 + 1;
      pbVar13 = (b->d).fmt;
      *(undefined8 *)((long)piVar20 + -8) = 0x11f7f3;
      pbVar13 = (bcf_fmt_t *)realloc(pbVar13,(long)(int)uVar22 * 0x20 + 0x20);
      (b->d).fmt = pbVar13;
      iVar16 = (b->d).m_fmt;
    }
    if (0 < iVar16) {
      lVar12 = 0x1c;
      lVar18 = 0;
      do {
        puVar2 = (uint *)((long)&((b->d).fmt)->id + lVar12);
        *puVar2 = *puVar2 & 0x7fffffff;
        lVar18 = lVar18 + 1;
        lVar12 = lVar12 + 0x20;
      } while (lVar18 < (b->d).m_fmt);
    }
    uVar9 = *(ulong *)&b->field_0x10;
    if ((char)(uVar9 >> 0x20) != '\0') {
      lVar12 = 0x1c;
      uVar21 = 0;
      do {
        if ((*pbVar28 & 0xf) == 2) {
          pbVar25 = pbVar28 + 3;
          iVar16 = (int)*(short *)(pbVar28 + 1);
        }
        else if ((*pbVar28 & 0xf) == 1) {
          pbVar25 = pbVar28 + 2;
          iVar16 = (int)(char)pbVar28[1];
        }
        else {
          pbVar25 = pbVar28 + 5;
          iVar16 = *(int *)(pbVar28 + 1);
        }
        pbVar13 = (b->d).fmt;
        *(int *)((long)pbVar13 + lVar12 + -0x1c) = iVar16;
        bVar3 = *pbVar25;
        *(uint *)((long)pbVar13 + lVar12 + -0x10) = bVar3 & 0xf;
        if (*pbVar25 < 0xf0) {
          pbVar24 = pbVar25 + 1;
          uVar22 = (uint)(*pbVar25 >> 4);
        }
        else if ((pbVar25[1] & 0xf) == 2) {
          uVar22 = (uint)*(short *)(pbVar25 + 2);
          pbVar24 = pbVar25 + 4;
        }
        else if ((pbVar25[1] & 0xf) == 1) {
          uVar22 = (uint)(char)pbVar25[2];
          pbVar24 = pbVar25 + 3;
        }
        else {
          uVar22 = *(uint *)(pbVar25 + 2);
          pbVar24 = pbVar25 + 6;
        }
        *(uint *)((long)pbVar13 + lVar12 + -0x18) = uVar22;
        iVar16 = uVar22 << (bcf_type_shift[bVar3 & 0xf] & 0x1f);
        *(int *)((long)pbVar13 + lVar12 + -0x14) = iVar16;
        *(byte **)((long)pbVar13 + lVar12 + -0xc) = pbVar24;
        *(uint *)((long)&pbVar13->id + lVar12) = (int)pbVar24 - (int)pbVar28 & 0x7fffffff;
        iVar16 = iVar16 * (uint)(uVar9 >> 0x28);
        pbVar28 = pbVar24 + iVar16;
        *(int *)((long)pbVar13 + lVar12 + -4) = iVar16;
        uVar21 = uVar21 + 1;
        uVar9 = *(ulong *)&b->field_0x10;
        lVar12 = lVar12 + 0x20;
      } while (uVar21 < (uVar9 >> 0x20 & 0xff));
    }
    *(byte *)&b->unpacked = (byte)b->unpacked | 8;
  }
  return 0;
}

Assistant:

int bcf_unpack(bcf1_t *b, int which)
{
    if ( !b->shared.l ) return 0; // Building a new BCF record from scratch
    uint8_t *ptr = (uint8_t*)b->shared.s, *ptr_ori;
    int *offset, i;
    bcf_dec_t *d = &b->d;
    if (which & BCF_UN_FLT) which |= BCF_UN_STR;
    if (which & BCF_UN_INFO) which |= BCF_UN_SHR;
    if ((which&BCF_UN_STR) && !(b->unpacked&BCF_UN_STR))
    {
        kstring_t tmp;

        // ID
        tmp.l = 0; tmp.s = d->id; tmp.m = d->m_id;
        ptr_ori = ptr;
        ptr = bcf_fmt_sized_array(&tmp, ptr);
        b->unpack_size[0] = ptr - ptr_ori;
        kputc('\0', &tmp);
        d->id = tmp.s; d->m_id = tmp.m;

        // REF and ALT are in a single block (d->als) and d->alleles are pointers into this block
        tmp.l = 0; tmp.s = d->als; tmp.m = d->m_als;
        offset = (int*)alloca(b->n_allele * sizeof(int));
        ptr_ori = ptr;
        for (i = 0; i < b->n_allele; ++i) {
            offset[i] = tmp.l;
            ptr = bcf_fmt_sized_array(&tmp, ptr);
            kputc('\0', &tmp);
        }
        b->unpack_size[1] = ptr - ptr_ori;
        d->als = tmp.s; d->m_als = tmp.m;

        hts_expand(char*, b->n_allele, d->m_allele, d->allele); // NM: hts_expand() is a macro
        for (i = 0; i < b->n_allele; ++i)
            d->allele[i] = d->als + offset[i];
        b->unpacked |= BCF_UN_STR;
    }
    if ((which&BCF_UN_FLT) && !(b->unpacked&BCF_UN_FLT)) { // FILTER
        ptr = (uint8_t*)b->shared.s + b->unpack_size[0] + b->unpack_size[1];
        ptr_ori = ptr;
        if (*ptr>>4) {
            int type;
            d->n_flt = bcf_dec_size(ptr, &ptr, &type);
            hts_expand(int, d->n_flt, d->m_flt, d->flt);
            for (i = 0; i < d->n_flt; ++i)
                d->flt[i] = bcf_dec_int1(ptr, type, &ptr);
        } else ++ptr, d->n_flt = 0;
        b->unpack_size[2] = ptr - ptr_ori;
        b->unpacked |= BCF_UN_FLT;
    }
    if ((which&BCF_UN_INFO) && !(b->unpacked&BCF_UN_INFO)) { // INFO
        ptr = (uint8_t*)b->shared.s + b->unpack_size[0] + b->unpack_size[1] + b->unpack_size[2];
        hts_expand(bcf_info_t, b->n_info, d->m_info, d->info);
        for (i = 0; i < d->m_info; ++i) d->info[i].vptr_free = 0;
        for (i = 0; i < b->n_info; ++i)
            ptr = bcf_unpack_info_core1(ptr, &d->info[i]);
        b->unpacked |= BCF_UN_INFO;
    }
    if ((which&BCF_UN_FMT) && b->n_sample && !(b->unpacked&BCF_UN_FMT)) { // FORMAT
        ptr = (uint8_t*)b->indiv.s;
        hts_expand(bcf_fmt_t, b->n_fmt, d->m_fmt, d->fmt);
        for (i = 0; i < d->m_fmt; ++i) d->fmt[i].p_free = 0;
        for (i = 0; i < b->n_fmt; ++i)
            ptr = bcf_unpack_fmt_core1(ptr, b->n_sample, &d->fmt[i]);
        b->unpacked |= BCF_UN_FMT;
    }
    return 0;
}